

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O1

void __thiscall winmd::reader::database::database(database *this,string_view *path,cache *cache)

{
  char *pcVar1;
  size_t sVar2;
  table_base *ptVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *local_38;
  uint8_t *local_30;
  
  (this->TypeRef).super_table_base.m_database = this;
  (this->TypeRef).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->TypeRef).super_table_base;
  (this->TypeRef).super_table_base.m_row_count = 0;
  (this->TypeRef).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->TypeRef).super_table_base.m_columns._M_elems[1].offset = '\0';
  *(undefined8 *)((long)&(this->TypeRef).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->TypeRef).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->GenericParamConstraint).super_table_base.m_database = this;
  (this->GenericParamConstraint).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->GenericParamConstraint).super_table_base;
  (this->GenericParamConstraint).super_table_base.m_row_count = 0;
  (this->GenericParamConstraint).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->GenericParamConstraint).super_table_base.m_columns._M_elems[1].offset = '\0';
  *(undefined8 *)((long)&(this->GenericParamConstraint).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->GenericParamConstraint).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->TypeSpec).super_table_base.m_database = this;
  (this->TypeSpec).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->TypeSpec).super_table_base;
  (this->TypeSpec).super_table_base.m_row_count = 0;
  (this->TypeSpec).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->TypeSpec).super_table_base.m_columns._M_elems[1].offset = '\0';
  *(undefined8 *)((long)&(this->TypeSpec).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->TypeSpec).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->TypeDef).super_table_base.m_database = this;
  (this->TypeDef).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->TypeDef).super_table_base;
  (this->TypeDef).super_table_base.m_row_count = 0;
  (this->TypeDef).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->TypeDef).super_table_base.m_columns._M_elems[1].offset = '\0';
  *(undefined8 *)((long)&(this->TypeDef).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->TypeDef).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->CustomAttribute).super_table_base.m_database = this;
  (this->CustomAttribute).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->CustomAttribute).super_table_base;
  (this->CustomAttribute).super_table_base.m_row_count = 0;
  (this->CustomAttribute).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->CustomAttribute).super_table_base.m_columns._M_elems[1].offset = '\0';
  *(undefined8 *)((long)&(this->CustomAttribute).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->CustomAttribute).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->MethodDef).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->MethodDef).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->MethodDef).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->MethodDef).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->MethodDef).super_table_base;
  (this->MethodDef).super_table_base.m_row_count = 0;
  (this->MethodDef).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->MethodDef).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->MemberRef).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->MemberRef).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->MemberRef).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->MemberRef).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->MemberRef).super_table_base;
  (this->MemberRef).super_table_base.m_row_count = 0;
  (this->MemberRef).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->MemberRef).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->Module).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->Module).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->Module).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->Module).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->Module).super_table_base;
  (this->Module).super_table_base.m_row_count = 0;
  (this->Module).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->Module).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->Param).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->Param).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->Param).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->Param).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->Param).super_table_base;
  (this->Param).super_table_base.m_row_count = 0;
  (this->Param).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->Param).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->InterfaceImpl).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->InterfaceImpl).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->InterfaceImpl).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->InterfaceImpl).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->InterfaceImpl).super_table_base;
  (this->InterfaceImpl).super_table_base.m_row_count = 0;
  (this->InterfaceImpl).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->InterfaceImpl).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->Constant).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->Constant).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->Constant).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->Constant).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->Constant).super_table_base;
  (this->Constant).super_table_base.m_row_count = 0;
  (this->Constant).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->Constant).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->Field).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->Field).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->Field).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->Field).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->Field).super_table_base;
  (this->Field).super_table_base.m_row_count = 0;
  (this->Field).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->Field).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->FieldMarshal).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->FieldMarshal).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->FieldMarshal).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->FieldMarshal).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->FieldMarshal).super_table_base;
  (this->FieldMarshal).super_table_base.m_row_count = 0;
  (this->FieldMarshal).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->FieldMarshal).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->DeclSecurity).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->DeclSecurity).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->DeclSecurity).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->DeclSecurity).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->DeclSecurity).super_table_base;
  (this->DeclSecurity).super_table_base.m_row_count = 0;
  (this->DeclSecurity).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->DeclSecurity).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->ClassLayout).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->ClassLayout).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->ClassLayout).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->ClassLayout).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->ClassLayout).super_table_base;
  (this->ClassLayout).super_table_base.m_row_count = 0;
  (this->ClassLayout).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->ClassLayout).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->FieldLayout).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->FieldLayout).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->FieldLayout).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->FieldLayout).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->FieldLayout).super_table_base;
  (this->FieldLayout).super_table_base.m_row_count = 0;
  (this->FieldLayout).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->FieldLayout).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->StandAloneSig).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->StandAloneSig).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->StandAloneSig).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->StandAloneSig).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->StandAloneSig).super_table_base;
  (this->StandAloneSig).super_table_base.m_row_count = 0;
  (this->StandAloneSig).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->StandAloneSig).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->EventMap).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->EventMap).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->EventMap).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->EventMap).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->EventMap).super_table_base;
  (this->EventMap).super_table_base.m_row_count = 0;
  (this->EventMap).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->EventMap).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->Event).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->Event).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->Event).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->Event).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->Event).super_table_base;
  (this->Event).super_table_base.m_row_count = 0;
  (this->Event).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->Event).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->PropertyMap).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->PropertyMap).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->PropertyMap).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->PropertyMap).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->PropertyMap).super_table_base;
  (this->PropertyMap).super_table_base.m_row_count = 0;
  (this->PropertyMap).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->PropertyMap).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->Property).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->Property).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->Property).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->Property).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->Property).super_table_base;
  (this->Property).super_table_base.m_row_count = 0;
  (this->Property).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->Property).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->MethodSemantics).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->MethodSemantics).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->MethodSemantics).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->MethodSemantics).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->MethodSemantics).super_table_base;
  (this->MethodSemantics).super_table_base.m_row_count = 0;
  (this->MethodSemantics).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->MethodSemantics).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->MethodImpl).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->MethodImpl).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->MethodImpl).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->MethodImpl).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->MethodImpl).super_table_base;
  (this->MethodImpl).super_table_base.m_row_count = 0;
  (this->MethodImpl).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->MethodImpl).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->ModuleRef).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->ModuleRef).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->ModuleRef).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->ModuleRef).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->ModuleRef).super_table_base;
  (this->ModuleRef).super_table_base.m_row_count = 0;
  (this->ModuleRef).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->ModuleRef).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->ImplMap).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->ImplMap).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->ImplMap).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->ImplMap).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->ImplMap).super_table_base;
  (this->ImplMap).super_table_base.m_row_count = 0;
  (this->ImplMap).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->ImplMap).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->FieldRVA).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->FieldRVA).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->FieldRVA).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->FieldRVA).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->FieldRVA).super_table_base;
  (this->FieldRVA).super_table_base.m_row_count = 0;
  (this->FieldRVA).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->FieldRVA).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->Assembly).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->Assembly).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->Assembly).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->Assembly).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->Assembly).super_table_base;
  (this->Assembly).super_table_base.m_row_count = 0;
  (this->Assembly).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->Assembly).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->AssemblyProcessor).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->AssemblyProcessor).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->AssemblyProcessor).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->AssemblyProcessor).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->AssemblyProcessor).super_table_base;
  (this->AssemblyProcessor).super_table_base.m_row_count = 0;
  (this->AssemblyProcessor).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->AssemblyProcessor).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->AssemblyOS).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->AssemblyOS).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->AssemblyOS).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->AssemblyOS).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->AssemblyOS).super_table_base;
  (this->AssemblyOS).super_table_base.m_row_count = 0;
  (this->AssemblyOS).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->AssemblyOS).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->AssemblyRef).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->AssemblyRef).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->AssemblyRef).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->AssemblyRef).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->AssemblyRef).super_table_base;
  (this->AssemblyRef).super_table_base.m_row_count = 0;
  (this->AssemblyRef).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->AssemblyRef).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->AssemblyRefProcessor).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->AssemblyRefProcessor).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->AssemblyRefProcessor).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->AssemblyRefProcessor).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->AssemblyRefProcessor).super_table_base;
  (this->AssemblyRefProcessor).super_table_base.m_row_count = 0;
  (this->AssemblyRefProcessor).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->AssemblyRefProcessor).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->AssemblyRefOS).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->AssemblyRefOS).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->AssemblyRefOS).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->AssemblyRefOS).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->AssemblyRefOS).super_table_base;
  (this->AssemblyRefOS).super_table_base.m_row_count = 0;
  (this->AssemblyRefOS).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->AssemblyRefOS).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->File).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->File).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->File).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->File).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->File).super_table_base;
  (this->File).super_table_base.m_row_count = 0;
  (this->File).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->File).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->ExportedType).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->ExportedType).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->ExportedType).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->ExportedType).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->ExportedType).super_table_base;
  (this->ExportedType).super_table_base.m_row_count = 0;
  (this->ExportedType).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->ExportedType).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->ManifestResource).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->ManifestResource).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->ManifestResource).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->ManifestResource).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->ManifestResource).super_table_base;
  (this->ManifestResource).super_table_base.m_row_count = 0;
  (this->ManifestResource).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->ManifestResource).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->NestedClass).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->NestedClass).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->NestedClass).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->NestedClass).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->NestedClass).super_table_base;
  (this->NestedClass).super_table_base.m_row_count = 0;
  (this->NestedClass).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->NestedClass).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->GenericParam).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->GenericParam).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->GenericParam).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->GenericParam).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->GenericParam).super_table_base;
  (this->GenericParam).super_table_base.m_row_count = 0;
  (this->GenericParam).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->GenericParam).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->MethodSpec).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->MethodSpec).super_table_base.m_row_count + 1) = 0;
  ptVar3 = &(this->MethodSpec).super_table_base;
  (ptVar3->m_columns)._M_elems[2].offset = '\0';
  (ptVar3->m_columns)._M_elems[2].size = '\0';
  (ptVar3->m_columns)._M_elems[3].offset = '\0';
  (ptVar3->m_columns)._M_elems[3].size = '\0';
  (ptVar3->m_columns)._M_elems[4].offset = '\0';
  (ptVar3->m_columns)._M_elems[4].size = '\0';
  (ptVar3->m_columns)._M_elems[5].offset = '\0';
  (ptVar3->m_columns)._M_elems[5].size = '\0';
  (this->MethodSpec).super_table_base.m_data = (uint8_t *)0x0;
  ptVar3 = &(this->MethodSpec).super_table_base;
  (this->MethodSpec).super_table_base.m_row_count = 0;
  (this->MethodSpec).super_table_base.m_row_size = '\0';
  (ptVar3->m_columns)._M_elems[0].offset = '\0';
  (ptVar3->m_columns)._M_elems[0].size = '\0';
  (this->MethodSpec).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  file_view::open_file((file_view *)&local_38,path);
  puVar5 = local_30;
  puVar4 = local_38;
  local_38 = (uint8_t *)0x0;
  (this->m_view).super_byte_view.m_first = puVar4;
  local_30 = (uint8_t *)0x0;
  (this->m_view).super_byte_view.m_last = puVar5;
  (this->m_view).m_backed_by_file = true;
  pcVar1 = path->_M_str;
  sVar2 = path->_M_len;
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_path,pcVar1,pcVar1 + sVar2);
  (this->m_guids).m_first = (uint8_t *)0x0;
  (this->m_guids).m_last = (uint8_t *)0x0;
  (this->m_blobs).m_first = (uint8_t *)0x0;
  (this->m_blobs).m_last = (uint8_t *)0x0;
  (this->m_strings).m_first = (uint8_t *)0x0;
  (this->m_strings).m_last = (uint8_t *)0x0;
  this->m_cache = cache;
  initialize(this);
  return;
}

Assistant:

explicit database(std::string_view const& path, cache const* cache = nullptr) : m_view{ path }, m_path{ path }, m_cache{ cache }
        {
            initialize();
        }